

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

data_view * __thiscall helics::ValueFederateManager::getValue(ValueFederateManager *this,Input *inp)

{
  long lVar1;
  long in_RDX;
  long in_RSI;
  data_view *in_RDI;
  InputData *iData;
  
  lVar1 = *(long *)(in_RDX + 0x48);
  if (lVar1 == 0) {
    memset(in_RDI,0,0x20);
    data_view::data_view(in_RDI);
  }
  else {
    *(undefined8 *)(lVar1 + 0x30) = *(undefined8 *)(in_RSI + 0x1f8);
    *(undefined1 *)(lVar1 + 0xe0) = 0;
    data_view::data_view(in_RDI,in_RDI);
  }
  return in_RDI;
}

Assistant:

data_view ValueFederateManager::getValue(const Input& inp)
{
    auto* iData = static_cast<InputData*>(inp.dataReference);
    if (iData != nullptr) {
        iData->lastQuery = CurrentTime;
        iData->hasUpdate = false;
        return iData->lastData;
    }
    return data_view();
}